

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::Executor::Impl::processAsyncCancellations
          (Impl *this,Vector<kj::_::XThreadEvent_*> *eventsToCancelOutsideLock)

{
  XThreadEvent **ppXVar1;
  PromiseArenaMember *node;
  XThreadEvent **event_1;
  XThreadEvent **ppXVar2;
  Vector<kj::_::XThreadEvent_*> *__range2;
  XThreadEvent **event;
  
  ppXVar1 = (eventsToCancelOutsideLock->builder).pos;
  for (ppXVar2 = (eventsToCancelOutsideLock->builder).ptr; ppXVar2 != ppXVar1; ppXVar2 = ppXVar2 + 1
      ) {
    node = &(((*ppXVar2)->promiseNode).ptr.ptr)->super_PromiseArenaMember;
    ((*ppXVar2)->promiseNode).ptr.ptr = (PromiseNode *)0x0;
    if (node != (PromiseArenaMember *)0x0) {
      kj::_::PromiseDisposer::dispose(node);
    }
    kj::_::Event::disarm(&(*ppXVar2)->super_Event);
  }
  kj::_::Mutex::lock((Mutex *)this);
  ppXVar1 = (eventsToCancelOutsideLock->builder).pos;
  for (ppXVar2 = (eventsToCancelOutsideLock->builder).ptr; ppXVar2 != ppXVar1; ppXVar2 = ppXVar2 + 1
      ) {
    (*ppXVar2)->state = DONE;
  }
  kj::_::Mutex::unlock((Mutex *)this,EXCLUSIVE,(Waiter *)0x0);
  return;
}

Assistant:

void processAsyncCancellations(Vector<_::XThreadEvent*>& eventsToCancelOutsideLock) {
    // After calling dispatchAll() or dispatchCancels() with the lock held, it may be that some
    // cancellations require dropping the lock before destroying the promiseNode. In that case
    // those cancellations will be added to the eventsToCancelOutsideLock Vector passed to the
    // method. That vector must then be passed to processAsyncCancellations() as soon as the lock
    // is released.

    for (auto& event: eventsToCancelOutsideLock) {
      event->promiseNode = kj::none;
      event->disarm();
    }

    // Now we need to mark all the events "done" under lock.
    auto lock = state.lockExclusive();
    for (auto& event: eventsToCancelOutsideLock) {
      event->setDoneState();
    }
  }